

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

void __thiscall spvtools::opt::IRContext::BuildInvalidAnalyses(IRContext *this,Analysis set)

{
  _Rb_tree_header *p_Var1;
  byte *pbVar2;
  Module *pMVar3;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *this_00;
  uint32_t index;
  pointer __p;
  Analysis AVar4;
  Instruction *debug_inst;
  Instruction *this_01;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> local_40;
  
  AVar4 = ~this->valid_analyses_ & set;
  if ((AVar4 & kAnalysisBegin) != kAnalysisNone) {
    BuildDefUseManager(this);
  }
  if ((AVar4 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    BuildInstrToBlockMapping(this);
  }
  if ((AVar4 & kAnalysisDecorations) != kAnalysisNone) {
    BuildDecorationManager(this);
  }
  if ((AVar4 & kAnalysisCFG) != kAnalysisNone) {
    BuildCFG(this);
  }
  if ((AVar4 & kAnalysisDominatorAnalysis) != kAnalysisNone) {
    ResetDominatorAnalysis(this);
  }
  if ((AVar4 & kAnalysisLoopAnalysis) != kAnalysisNone) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>_>_>
    ::_M_deallocate_nodes
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>,_false>_>_>
                *)&this->loop_descriptors_,
               (__node_ptr)(this->loop_descriptors_)._M_h._M_before_begin._M_nxt);
    memset((this->loop_descriptors_)._M_h._M_buckets,0,
           (this->loop_descriptors_)._M_h._M_bucket_count << 3);
    (this->loop_descriptors_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this->loop_descriptors_)._M_h._M_element_count = 0;
    *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisLoopAnalysis;
  }
  if ((AVar4 >> 0xc & 1) != 0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->builtin_var_id_map_)._M_h);
    pbVar2 = (byte *)((long)&this->valid_analyses_ + 1);
    *pbVar2 = *pbVar2 | 0x10;
  }
  if ((char)AVar4 < '\0') {
    __p = (pointer)operator_new(0x30);
    p_Var1 = &(__p->_M_t)._M_impl.super__Rb_tree_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(undefined8 *)&(__p->_M_t)._M_impl = 0;
    *(undefined8 *)&(__p->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
             *)&this->id_to_name_,__p);
    pMVar3 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    for (this_01 = *(Instruction **)
                    ((long)&(pMVar3->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> +
                    0x10);
        this_01 !=
        (Instruction *)
        ((long)&(pMVar3->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
        this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      if (this_01->opcode_ - OpName < 2) {
        this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                   *)(this->id_to_name_)._M_t.
                     super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                     ._M_head_impl;
        index = (this_01->has_result_id_ & 1) + 1;
        if (this_01->has_type_id_ == false) {
          index = (uint)this_01->has_result_id_;
        }
        local_40.first = Instruction::GetSingleWordOperand(this_01,index);
        local_40.second = this_01;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
        ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                  (this_00,&local_40);
      }
    }
    *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisNameMap;
  }
  if ((AVar4 >> 8 & 1) != 0) {
    BuildScalarEvolutionAnalysis(this);
  }
  if ((AVar4 >> 9 & 1) != 0) {
    BuildRegPressureAnalysis(this);
  }
  if ((AVar4 >> 10 & 1) != 0) {
    BuildValueNumberTable(this);
  }
  if ((AVar4 >> 0xb & 1) != 0) {
    BuildStructuredCFGAnalysis(this);
  }
  if ((AVar4 >> 0xd & 1) != 0) {
    BuildIdToFuncMapping(this);
  }
  if ((AVar4 >> 0xe & 1) != 0) {
    BuildConstantManager(this);
  }
  if ((short)AVar4 < 0) {
    BuildTypeManager(this);
  }
  if ((AVar4 >> 0x10 & 1) != 0) {
    BuildDebugInfoManager(this);
  }
  if ((AVar4 >> 0x11 & 1) != 0) {
    BuildLivenessManager(this);
  }
  return;
}

Assistant:

void IRContext::BuildInvalidAnalyses(IRContext::Analysis set) {
  set = Analysis(set & ~valid_analyses_);

  if (set & kAnalysisDefUse) {
    BuildDefUseManager();
  }
  if (set & kAnalysisInstrToBlockMapping) {
    BuildInstrToBlockMapping();
  }
  if (set & kAnalysisDecorations) {
    BuildDecorationManager();
  }
  if (set & kAnalysisCFG) {
    BuildCFG();
  }
  if (set & kAnalysisDominatorAnalysis) {
    ResetDominatorAnalysis();
  }
  if (set & kAnalysisLoopAnalysis) {
    ResetLoopAnalysis();
  }
  if (set & kAnalysisBuiltinVarId) {
    ResetBuiltinAnalysis();
  }
  if (set & kAnalysisNameMap) {
    BuildIdToNameMap();
  }
  if (set & kAnalysisScalarEvolution) {
    BuildScalarEvolutionAnalysis();
  }
  if (set & kAnalysisRegisterPressure) {
    BuildRegPressureAnalysis();
  }
  if (set & kAnalysisValueNumberTable) {
    BuildValueNumberTable();
  }
  if (set & kAnalysisStructuredCFG) {
    BuildStructuredCFGAnalysis();
  }
  if (set & kAnalysisIdToFuncMapping) {
    BuildIdToFuncMapping();
  }
  if (set & kAnalysisConstants) {
    BuildConstantManager();
  }
  if (set & kAnalysisTypes) {
    BuildTypeManager();
  }
  if (set & kAnalysisDebugInfo) {
    BuildDebugInfoManager();
  }
  if (set & kAnalysisLiveness) {
    BuildLivenessManager();
  }
}